

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O2

fb_symbol_t * lookup_reference(fb_parser_t *P,fb_scope_t *local,fb_ref_t *name,fb_ref_t **enumval)

{
  fb_ref_t *pfVar1;
  int iVar2;
  fb_symbol_t *pfVar3;
  fb_compound_type_t *pfVar4;
  fb_scope_t *pfVar5;
  fb_ref_t *pfVar6;
  fb_ref_t *pfVar7;
  fb_ref_t *pfVar8;
  
  iVar2 = 0;
  pfVar1 = (fb_ref_t *)0x0;
  pfVar7 = (fb_ref_t *)0x0;
  for (pfVar6 = name; pfVar8 = pfVar1, pfVar6 != (fb_ref_t *)0x0; pfVar6 = pfVar6->link) {
    iVar2 = iVar2 + 1;
    pfVar1 = pfVar6;
    pfVar7 = pfVar8;
  }
  if (enumval != (fb_ref_t **)0x0) {
    iVar2 = iVar2 + -1;
    *enumval = pfVar8;
    pfVar8 = pfVar7;
  }
  if (pfVar8 != (fb_ref_t *)0x0) {
    if (iVar2 == 1 && local != (fb_scope_t *)0x0) {
      do {
        pfVar3 = find_fb_symbol_by_token(&local->symbol_index,pfVar8->ident);
        if ((pfVar3 != (fb_symbol_t *)0x0) &&
           (pfVar4 = get_compound_if_visible(&P->schema,pfVar3), pfVar4 != (fb_compound_type_t *)0x0
           )) {
          return pfVar3;
        }
        local = find_parent_scope(P,local);
      } while (local != (fb_scope_t *)0x0);
    }
    else {
      if (iVar2 == 1) {
        name = (fb_ref_t *)0x0;
      }
      pfVar5 = fb_find_scope_by_ref(&P->schema,name,iVar2 + -1);
      if (pfVar5 == (fb_scope_t *)0x0) {
        return (fb_symbol_t *)0x0;
      }
      pfVar3 = find_fb_symbol_by_token(&pfVar5->symbol_index,pfVar8->ident);
      if ((pfVar3 != (fb_symbol_t *)0x0) &&
         (pfVar4 = get_compound_if_visible(&P->schema,pfVar3), pfVar4 != (fb_compound_type_t *)0x0))
      {
        return pfVar3;
      }
    }
  }
  return (fb_symbol_t *)0x0;
}

Assistant:

static inline fb_symbol_t *lookup_reference(fb_parser_t *P, fb_scope_t *local, fb_ref_t *name, fb_ref_t **enumval)
{
    fb_ref_t *basename, *last, *p;
    fb_scope_t *scope;
    fb_symbol_t *sym;
    int count;

    count = 0;
    scope = 0;
    p = name;
    last = 0;
    basename = 0;
    while (p) {
        basename = last;
        last = p;
        p = p->link;
        ++count;
    }
    if (enumval) {
        --count;
        *enumval = last;
    } else {
        basename = last;
    }
    if (!basename) {
        return 0;
    }
    if (local && count == 1) {
        do {
            if ((sym = find_fb_symbol_by_token(&local->symbol_index, basename->ident))) {
                if (get_compound_if_visible(&P->schema, sym)) {
                    return sym;
                }
            }
            local = find_parent_scope(P, local);
        } while (local);
        return 0;
    }
    /* Null name is valid in scope lookup, indicating global scope. */
    if (count == 1) {
        name = 0;
    }
    if (!(scope = fb_find_scope_by_ref(&P->schema, name, count - 1))) {
        return 0;
    }
    sym = find_fb_symbol_by_token(&scope->symbol_index, basename->ident);
    if (sym && get_compound_if_visible(&P->schema, sym)) {
        return sym;
    }
    return 0;
}